

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O1

void Rwr_ManPrecompute(Rwr_Man_t *p)

{
  Rwr_Node_t *p0;
  Rwr_Node_t *p1;
  void **ppvVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  int Level;
  long lVar8;
  uint uVar9;
  int Volume;
  ulong local_60;
  uint local_54;
  long local_50;
  
  pVVar5 = p->vForest;
  if (1 < pVVar5->nSize) {
    local_54 = 0xffffffff;
    local_60 = 1;
    local_50 = 0;
    do {
      pVVar6 = p->vForest;
      if (1 < pVVar6->nSize) {
        p0 = (Rwr_Node_t *)pVVar5->pArray[local_60];
        lVar8 = 1;
        do {
          p1 = (Rwr_Node_t *)pVVar6->pArray[lVar8];
          uVar9 = (byte)p0->field_0x11 & 0x3f;
          if ((int)local_54 < (int)uVar9) {
            printf("Starting level %d  (at %d nodes).\n",(ulong)(uVar9 + 1),local_60 & 0xffffffff);
            printf("Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n",
                   (ulong)(uint)(p->nConsidered / 1000000),(ulong)(uint)p->vForest->nSize,
                   (ulong)(uint)p->nClasses,local_60 & 0xffffffff);
            local_54 = uVar9;
          }
          if (local_50 + lVar8 == 1) break;
          uVar3 = (byte)p0->field_0x11 & 0x3f;
          uVar9 = (byte)p1->field_0x11 & 0x3f;
          if (5 < uVar9 + uVar3) break;
          if (uVar9 < uVar3) {
            uVar9 = uVar3;
          }
          Level = uVar9 + 1;
          iVar4 = Rwr_ManNodeVolume(p,p0,p1);
          Volume = iVar4 + 1;
          Rwr_ManTryNode(p,p0,p1,0,Level,Volume);
          Rwr_ManTryNode(p,(Rwr_Node_t *)((ulong)p0 ^ 1),p1,0,Level,Volume);
          Rwr_ManTryNode(p,p0,(Rwr_Node_t *)((ulong)p1 ^ 1),0,Level,Volume);
          Rwr_ManTryNode(p,(Rwr_Node_t *)((ulong)p0 ^ 1),(Rwr_Node_t *)((ulong)p1 ^ 1),0,Level,
                         Volume);
          Rwr_ManTryNode(p,p0,p1,1,Level,iVar4 + 2);
          iVar4 = p->nConsidered;
          if ((iVar4 * 0x22e90e21 + 0x1500U >> 7 | iVar4 * 0x42000000) < 0x55) {
            printf("Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n",
                   (ulong)(uint)(iVar4 / 1000000),(ulong)(uint)p->vForest->nSize,
                   (ulong)(uint)p->nClasses,local_60);
          }
          if (p->vForest->nSize == 0x40005) {
            printf("Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n",
                   (ulong)(uint)(p->nConsidered / 1000000),0x40005,(ulong)(uint)p->nClasses,local_60
                  );
            goto LAB_00442cee;
          }
          lVar8 = lVar8 + 1;
          pVVar6 = p->vForest;
        } while (lVar8 < pVVar6->nSize);
      }
      local_60 = local_60 + 1;
      pVVar5 = p->vForest;
      local_50 = local_50 + -1;
    } while ((long)local_60 < (long)pVVar5->nSize);
  }
LAB_00442cee:
  uVar9 = p->nTravIds;
  p->nTravIds = uVar9 + 1;
  if (0x8ffffffe < uVar9) {
    lVar8 = (long)p->vForest->nSize;
    if (0 < lVar8) {
      ppvVar1 = p->vForest->pArray;
      lVar7 = 0;
      do {
        *(undefined4 *)((long)ppvVar1[lVar7] + 4) = 0;
        lVar7 = lVar7 + 1;
      } while (lVar8 != lVar7);
    }
    p->nTravIds = 1;
  }
  pVVar5 = p->vForest;
  uVar9 = 0;
  if (5 < pVVar5->nSize) {
    uVar9 = 0;
    lVar8 = 5;
    do {
      uVar3 = *(uint *)&((Rwr_Node_t *)pVVar5->pArray[lVar8])->field_0xe;
      if (p->puCanons[uVar3 & 0xffff] == (unsigned_short)uVar3) {
        Rwr_MarkUsed_rec(p,(Rwr_Node_t *)pVVar5->pArray[lVar8]);
        uVar9 = uVar9 + 1;
      }
      lVar8 = lVar8 + 1;
      pVVar5 = p->vForest;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = p->vForest;
  iVar4 = 5;
  if (5 < pVVar5->nSize) {
    iVar4 = 5;
    lVar8 = 5;
    do {
      piVar2 = (int *)pVVar5->pArray[lVar8];
      if ((*(byte *)((long)piVar2 + 0x11) & 0x40) != 0) {
        pVVar5->pArray[iVar4] = piVar2;
        *piVar2 = iVar4;
        iVar4 = iVar4 + 1;
      }
      lVar8 = lVar8 + 1;
      pVVar5 = p->vForest;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5->nSize = iVar4;
  printf("Total canonical = %4d. Total used = %5d.\n",(ulong)uVar9);
  return;
}

Assistant:

void Rwr_ManPrecompute( Rwr_Man_t * p )
{
    Rwr_Node_t * p0, * p1;
    int i, k, Level, Volume;
    int LevelOld = -1;
    int nNodes;

    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p0, i, 1 )
    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p1, k, 1 )
    {
        if ( LevelOld < (int)p0->Level )
        {
            LevelOld = p0->Level;
            printf( "Starting level %d  (at %d nodes).\n", LevelOld+1, i );
            printf( "Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n", 
                p->nConsidered/1000000, p->vForest->nSize, p->nClasses, i );
        }

        if ( k == i )
            break;
//        if ( p0->Level + p1->Level > 6 ) // hard
//            break;

        if ( p0->Level + p1->Level > 5 ) // easy 
            break;

//        if ( p0->Level + p1->Level > 6 || (p0->Level == 3 && p1->Level == 3) )
//            break;

        // compute the level and volume of the new nodes
        Level  = 1 + Abc_MaxInt( p0->Level, p1->Level );
        Volume = 1 + Rwr_ManNodeVolume( p, p0, p1 );
        // try four different AND nodes
        Rwr_ManTryNode( p,         p0 ,         p1 , 0, Level, Volume );
        Rwr_ManTryNode( p, Rwr_Not(p0),         p1 , 0, Level, Volume );
        Rwr_ManTryNode( p,         p0 , Rwr_Not(p1), 0, Level, Volume );
        Rwr_ManTryNode( p, Rwr_Not(p0), Rwr_Not(p1), 0, Level, Volume );
        // try EXOR
        Rwr_ManTryNode( p,         p0 ,         p1 , 1, Level, Volume + 1 );
        // report the progress
        if ( p->nConsidered % 50000000 == 0 )
            printf( "Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n", 
                p->nConsidered/1000000, p->vForest->nSize, p->nClasses, i );
        // quit after some time
        if ( p->vForest->nSize == RWR_LIMIT + 5 )
        {
            printf( "Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n", 
                p->nConsidered/1000000, p->vForest->nSize, p->nClasses, i );
            goto save;
        }
    }
save :

    // mark the relevant ones
    Rwr_ManIncTravId( p );
    k = 5;
    nNodes = 0;
    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p0, i, 5 )
        if ( p0->uTruth == p->puCanons[p0->uTruth] )
        {
            Rwr_MarkUsed_rec( p, p0 );
            nNodes++;
        }

    // compact the array by throwing away non-canonical
    k = 5;
    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p0, i, 5 )
        if ( p0->fUsed )
        {
            p->vForest->pArray[k] = p0;
            p0->Id = k++;
        }
    p->vForest->nSize = k;
    printf( "Total canonical = %4d. Total used = %5d.\n", nNodes, p->vForest->nSize );
}